

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int memjrnlWrite(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  sqlite3_io_methods *pFirst;
  sqlite3_io_methods *psVar1;
  sqlite3_io_methods *psVar2;
  sqlite3_io_methods *psVar3;
  sqlite3_io_methods *psVar4;
  sqlite3_io_methods *psVar5;
  sqlite3_io_methods *psVar6;
  sqlite3_io_methods *psVar7;
  int iVar8;
  int iVar9;
  sqlite3_file sVar10;
  sqlite3_io_methods *psVar11;
  int iVar12;
  sqlite3_io_methods *psVar13;
  long lVar14;
  int iVar15;
  size_t __n;
  
  iVar9 = *(int *)((long)&pJfd[1].pMethods + 4);
  if ((0 < (long)iVar9) && ((long)iVar9 < iAmt + iOfst)) {
    psVar13 = pJfd->pMethods;
    iVar12 = *(int *)&pJfd[1].pMethods;
    pFirst = pJfd[2].pMethods;
    psVar1 = pJfd[3].pMethods;
    psVar2 = pJfd[6].pMethods;
    psVar6 = pJfd[4].pMethods;
    psVar7 = pJfd[5].pMethods;
    psVar3 = pJfd[7].pMethods;
    psVar4 = pJfd[8].pMethods;
    psVar5 = pJfd[9].pMethods;
    pJfd->pMethods = (sqlite3_io_methods *)0x0;
    pJfd[1].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[2].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[4].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[7].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[8].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[9].pMethods = (sqlite3_io_methods *)0x0;
    iVar8 = (*psVar4->xSync)((sqlite3_file *)psVar4,(int)psVar5);
    if (iVar8 == 0) {
      lVar14 = 0;
      psVar11 = pFirst;
      iVar15 = iVar12;
      while( true ) {
        if (psVar11 == (sqlite3_io_methods *)0x0) {
          memjrnlFreeChunks((FileChunk *)pFirst);
          iVar9 = (*pJfd->pMethods->xWrite)(pJfd,zBuf,iAmt,iOfst);
          return iVar9;
        }
        if ((long)psVar1 < iVar15 + lVar14) {
          iVar15 = (int)psVar1 - (int)lVar14;
        }
        iVar8 = (*pJfd->pMethods->xWrite)(pJfd,&psVar11->xClose,iVar15,lVar14);
        if (iVar8 != 0) break;
        lVar14 = lVar14 + iVar15;
        psVar11 = *(sqlite3_io_methods **)psVar11;
      }
    }
    if (pJfd->pMethods != (sqlite3_io_methods *)0x0) {
      (*pJfd->pMethods->xClose)(pJfd);
    }
    pJfd->pMethods = psVar13;
    *(int *)&pJfd[1].pMethods = iVar12;
    *(int *)((long)&pJfd[1].pMethods + 4) = iVar9;
    pJfd[2].pMethods = pFirst;
    pJfd[3].pMethods = psVar1;
    pJfd[6].pMethods = psVar2;
    pJfd[4].pMethods = psVar6;
    pJfd[5].pMethods = psVar7;
    pJfd[7].pMethods = psVar3;
    pJfd[8].pMethods = psVar4;
    pJfd[9].pMethods = psVar5;
    return iVar8;
  }
  if (iOfst < 1) {
    if ((iOfst == 0) && (pJfd[2].pMethods != (sqlite3_io_methods *)0x0)) {
      memcpy(&(pJfd[2].pMethods)->xClose,zBuf,(long)iAmt);
      return 0;
    }
  }
  else if (pJfd[3].pMethods != (sqlite3_io_methods *)iOfst) {
    memjrnlTruncate(pJfd,iOfst);
  }
  do {
    if (iAmt < 1) {
      return 0;
    }
    psVar13 = pJfd[4].pMethods;
    iVar9 = *(int *)&pJfd[1].pMethods;
    lVar14 = (long)pJfd[3].pMethods % (long)iVar9;
    iVar12 = iVar9 - (int)lVar14;
    if (iAmt < iVar12) {
      iVar12 = iAmt;
    }
    sVar10.pMethods = psVar13;
    if (lVar14 == 0) {
      sVar10.pMethods = (sqlite3_io_methods *)sqlite3_malloc(iVar9 + 8);
      if (sVar10.pMethods == (sqlite3_io_methods *)0x0) {
        return 0xc0a;
      }
      *(undefined8 *)sVar10.pMethods = 0;
      if (psVar13 == (sqlite3_io_methods *)0x0) {
        psVar13 = (sqlite3_io_methods *)(pJfd + 2);
      }
      *(sqlite3_io_methods **)psVar13 = sVar10.pMethods;
      pJfd[4].pMethods = sVar10.pMethods;
    }
    __n = (size_t)iVar12;
    memcpy((void *)((long)&(sVar10.pMethods)->xClose + lVar14),zBuf,__n);
    zBuf = (void *)((long)zBuf + __n);
    iAmt = iAmt - iVar12;
    pJfd[3].pMethods = (sqlite3_io_methods *)((long)&(pJfd[3].pMethods)->iVersion + __n);
  } while( true );
}

Assistant:

static int memjrnlWrite(
  sqlite3_file *pJfd,    /* The journal file into which to write */
  const void *zBuf,      /* Take data to be written from here */
  int iAmt,              /* Number of bytes to write */
  sqlite_int64 iOfst     /* Begin writing at this offset into the file */
){
  MemJournal *p = (MemJournal *)pJfd;
  int nWrite = iAmt;
  u8 *zWrite = (u8 *)zBuf;

  /* If the file should be created now, create it and write the new data
  ** into the file on disk. */
  if( p->nSpill>0 && (iAmt+iOfst)>p->nSpill ){
    int rc = memjrnlCreateFile(p);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsWrite(pJfd, zBuf, iAmt, iOfst);
    }
    return rc;
  }

  /* If the contents of this write should be stored in memory */
  else{
    /* An in-memory journal file should only ever be appended to. Random
    ** access writes are not required. The only exception to this is when
    ** the in-memory journal is being used by a connection using the
    ** atomic-write optimization. In this case the first 28 bytes of the
    ** journal file may be written as part of committing the transaction. */
    assert( iOfst<=p->endpoint.iOffset );
    if( iOfst>0 && iOfst!=p->endpoint.iOffset ){
      memjrnlTruncate(pJfd, iOfst);
    }
    if( iOfst==0 && p->pFirst ){
      assert( p->nChunkSize>iAmt );
      memcpy((u8*)p->pFirst->zChunk, zBuf, iAmt);
    }else{
      while( nWrite>0 ){
        FileChunk *pChunk = p->endpoint.pChunk;
        int iChunkOffset = (int)(p->endpoint.iOffset%p->nChunkSize);
        int iSpace = MIN(nWrite, p->nChunkSize - iChunkOffset);

        assert( pChunk!=0 || iChunkOffset==0 );
        if( iChunkOffset==0 ){
          /* New chunk is required to extend the file. */
          FileChunk *pNew = sqlite3_malloc(fileChunkSize(p->nChunkSize));
          if( !pNew ){
            return SQLITE_IOERR_NOMEM_BKPT;
          }
          pNew->pNext = 0;
          if( pChunk ){
            assert( p->pFirst );
            pChunk->pNext = pNew;
          }else{
            assert( !p->pFirst );
            p->pFirst = pNew;
          }
          pChunk = p->endpoint.pChunk = pNew;
        }

        assert( pChunk!=0 );
        memcpy((u8*)pChunk->zChunk + iChunkOffset, zWrite, iSpace);
        zWrite += iSpace;
        nWrite -= iSpace;
        p->endpoint.iOffset += iSpace;
      }
    }
  }

  return SQLITE_OK;
}